

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QMDP.cpp
# Opt level: O1

void __thiscall
QMDP::QMDP(QMDP *this,void **vtt,shared_ptr<const_PlanningUnitDecPOMDPDiscrete> *pu,
          bool useJaohQValuesCache)

{
  void *pvVar1;
  
  pvVar1 = *vtt;
  *(void **)this = pvVar1;
  *(void **)(&this->field_0x0 + *(long *)((long)pvVar1 + -0x98)) = vtt[1];
  *(void **)(&this->field_0x0 + *(long *)(*(long *)this + -0x80)) = vtt[2];
  *(void **)(&this->field_0x0 + *(long *)(*(long *)this + -0x60)) = vtt[3];
  *(void **)(&this->field_0x0 + *(long *)(*(long *)this + -0xa0)) = vtt[4];
  *(void **)(&this->field_0x0 + *(long *)(*(long *)this + -0xa8)) = vtt[5];
  this->_m_p = (MDPSolver *)0x0;
  this->_m_initialized = false;
  this->_m_useJaohQValuesCache = useJaohQValuesCache;
  return;
}

Assistant:

QMDP::QMDP(const boost::shared_ptr<const PlanningUnitDecPOMDPDiscrete> &pu,
           bool useJaohQValuesCache) :
    QFunctionForDecPOMDP(pu), //virtual base first
    QFunctionJAOH(pu),
    _m_p(0),
    _m_initialized(false),
    _m_useJaohQValuesCache(useJaohQValuesCache)
{
}